

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyParserNumber.cpp
# Opt level: O1

bool __thiscall
Rml::PropertyParserNumber::ParseValue
          (PropertyParserNumber *this,Property *property,String *value,ParameterMap *param_3)

{
  Unit UVar1;
  code *pcVar2;
  Table<true,80ul,std::__cxx11::string,Rml::Unit,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
  *pTVar3;
  bool bVar4;
  size_t sVar5;
  byte bVar6;
  size_type sVar7;
  long lVar8;
  float value_00;
  String str_number;
  String str_unit;
  char *str_end;
  long *local_c0 [2];
  long local_b0 [2];
  String local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  long *local_60;
  Variant local_58;
  
  sVar7 = value->_M_string_length;
  do {
    if (sVar7 == 0) break;
    bVar6 = (value->_M_dataplus)._M_p[sVar7 - 1];
    if ((byte)(bVar6 - 0x30) < 10) {
      bVar6 = 0;
    }
    else {
      bVar6 = (byte)(0x100002600 >> (bVar6 & 0x3f)) & bVar6 < 0x21 ^ 1;
    }
    sVar7 = sVar7 - 1;
  } while (bVar6 != 0);
  ::std::__cxx11::string::substr((ulong)local_c0,(ulong)value);
  ::std::__cxx11::string::substr((ulong)&local_a0,(ulong)value);
  StringUtilities::ToLower(&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  local_60 = (long *)0x0;
  value_00 = strtof((char *)local_c0[0],(char **)&local_60);
  if (local_c0[0] == local_60) goto LAB_0025ad40;
  if ((DAT_003418a8 ==
       (Table<true,80ul,std::__cxx11::string,Rml::Unit,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
        *)0x0) &&
     (bVar4 = Assert("Resource used before it was initialized, or after it was shut down.",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ControlledLifetimeResource.h"
                     ,0x46), !bVar4)) {
LAB_0025ad8c:
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  pTVar3 = DAT_003418a8;
  sVar5 = robin_hood::detail::
          Table<true,80ul,std::__cxx11::string,Rml::Unit,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
          ::findIdx<std::__cxx11::string>(DAT_003418a8,&local_80);
  lVar8 = sVar5 * 0x28 + *(long *)pTVar3;
  if ((DAT_003418a8 ==
       (Table<true,80ul,std::__cxx11::string,Rml::Unit,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
        *)0x0) &&
     (bVar4 = Assert("Resource used before it was initialized, or after it was shut down.",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ControlledLifetimeResource.h"
                     ,0x46), !bVar4)) goto LAB_0025ad8c;
  if (lVar8 == *(long *)(DAT_003418a8 + 8)) {
LAB_0025ad40:
    bVar4 = false;
  }
  else {
    UVar1 = *(Unit *)(lVar8 + 0x20);
    if ((this->units & UVar1) == UNKNOWN) {
      if (UVar1 != NUMBER) goto LAB_0025ad40;
      bVar4 = false;
      if (((this->zero_unit == UNKNOWN) || (bVar4 = false, value_00 != 0.0)) || (NAN(value_00)))
      goto LAB_0025ad42;
      property->unit = this->zero_unit;
      local_58.type = NONE;
      Variant::Set(&local_58,0.0);
      Variant::operator=(&property->value,&local_58);
      Variant::~Variant(&local_58);
    }
    else {
      Variant::Clear(&property->value);
      Variant::Set(&property->value,value_00);
      property->unit = UVar1;
    }
    bVar4 = true;
  }
LAB_0025ad42:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if (local_c0[0] != local_b0) {
    operator_delete(local_c0[0],local_b0[0] + 1);
  }
  return bVar4;
}

Assistant:

bool PropertyParserNumber::ParseValue(Property& property, const String& value, const ParameterMap& /*parameters*/) const
{
	// Find the beginning of the unit string in 'value'.
	size_t unit_pos = 0;
	for (size_t i = value.size(); i--;)
	{
		const char c = value[i];
		if ((c >= '0' && c <= '9') || StringUtilities::IsWhitespace(c))
		{
			unit_pos = i + 1;
			break;
		}
	}

	String str_number = value.substr(0, unit_pos);
	String str_unit = StringUtilities::ToLower(value.substr(unit_pos));

	char* str_end = nullptr;
	float float_value = strtof(str_number.c_str(), &str_end);
	if (str_number.c_str() == str_end)
	{
		// Number conversion failed
		return false;
	}

	const auto it = parser_data->unit_string_map.find(str_unit);
	if (it == parser_data->unit_string_map.end())
	{
		// Invalid unit name
		return false;
	}

	const Unit unit = it->second;

	if (Any(unit & units))
	{
		property.value = float_value;
		property.unit = unit;
		return true;
	}

	// Detected unit not allowed.
	// However, we allow a value of "0" if zero_unit is set and no unit specified (that is, unit is a pure NUMBER).
	if (unit == Unit::NUMBER)
	{
		if (zero_unit != Unit::UNKNOWN && float_value == 0.0f)
		{
			property.unit = zero_unit;
			property.value = Variant(0.0f);
			return true;
		}
	}

	return false;
}